

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Thread.cpp
# Opt level: O3

bool __thiscall chatra::Thread::assignmentOperator(Thread *this,Operator op)

{
  pointer pFVar1;
  pointer ppVar2;
  Node *pNVar3;
  bool bVar4;
  EvaluateValueResult EVar5;
  unsigned_long uVar6;
  Node *local_40;
  int local_34;
  
  pFVar1 = (this->frames).super__Vector_base<chatra::Frame,_std::allocator<chatra::Frame>_>._M_impl.
           super__Vector_impl_data._M_finish;
  ppVar2 = pFVar1[-1].stack.
           super__Vector_base<std::pair<chatra::Node_*,_unsigned_long>,_std::allocator<std::pair<chatra::Node_*,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  if (5 < ppVar2[-1].second) {
    bVar4 = assignmentOperator(this);
    return bVar4;
  }
  pNVar3 = ppVar2[-1].first;
  switch(ppVar2[-1].second) {
  case 0:
    ppVar2[-1].second = 1;
    local_40 = (((pNVar3->subNodes).
                 super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
                 ._M_impl.super__Vector_impl_data._M_start)->
               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    goto LAB_00160d05;
  case 1:
    ppVar2[-1].second = 2;
    Frame::duplicateTop(pFVar1 + -1);
    break;
  case 3:
    uVar6 = 4;
    goto LAB_00160cf9;
  case 4:
    EVar5 = evaluateValue(this,Value);
    if (EVar5 == Suspend) {
      return false;
    }
    if (EVar5 == StackChanged) {
      return true;
    }
  case 5:
    ppVar2[-1].second = 6;
    local_40 = (Node *)(&operatorNode + (uint)op * 0xc0);
    std::
    vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
    ::emplace_back<chatra::Node*,unsigned_long_const&>
              ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                *)&pFVar1[-1].stack,&local_40,&binaryOperatorProcessPhase);
    return true;
  }
  EVar5 = evaluateValue(this,Value);
  if (EVar5 == Suspend) {
    return false;
  }
  if (EVar5 != StackChanged) {
    uVar6 = ppVar2[-1].second + 1;
LAB_00160cf9:
    ppVar2[-1].second = uVar6;
    local_40 = (pNVar3->subNodes).
               super__Vector_base<std::shared_ptr<chatra::Node>,_std::allocator<std::shared_ptr<chatra::Node>_>_>
               ._M_impl.super__Vector_impl_data._M_start[1].
               super___shared_ptr<chatra::Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_00160d05:
    local_34 = 0;
    std::
    vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
    ::emplace_back<chatra::Node*,int>
              ((vector<std::pair<chatra::Node*,unsigned_long>,std::allocator<std::pair<chatra::Node*,unsigned_long>>>
                *)&pFVar1[-1].stack,&local_40,&local_34);
  }
  return true;
}

Assistant:

bool Thread::assignmentOperator(Operator op) {
	auto& f = frames.back();
	auto* node = f.stack.back().first;
	auto& nodePhase = f.stack.back().second;

	switch (nodePhase) {
	case 0:  nodePhase++;  f.stack.emplace_back(node->subNodes[0].get(), 0);  return true;
	case 1:  nodePhase++;  f.duplicateTop();  CHATRA_FALLTHROUGH;
	case 2:  CHATRA_EVALUATE_VALUE;
	case 3:  nodePhase++;  f.stack.emplace_back(node->subNodes[1].get(), 0);  return true;
	case 4:  CHATRA_EVALUATE_VALUE;
	case 5: {
		nodePhase = assignmentOperatorProcessPhase;
		f.stack.emplace_back(&operatorNode[static_cast<size_t>(op)], binaryOperatorProcessPhase);
		return true;
	}
	default:
		return assignmentOperator();
	}
}